

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::runTest
          (TransformFeedbackCase *this,DrawCall *first,DrawCall *end,deUint32 seed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Precision PVar2;
  TextureFormat log;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var3;
  code *pcVar4;
  Attribute *pAVar5;
  RenderContext *pRVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  DataType DVar17;
  undefined4 uVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ObjectTraits *traits;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var21;
  pointer puVar22;
  void *__s;
  undefined8 *puVar23;
  pointer pOVar24;
  pointer ppAVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  uint x;
  uint y;
  undefined8 uVar29;
  DrawCall *pDVar30;
  pointer pAVar31;
  byte bVar32;
  ulong uVar33;
  ostringstream *poVar34;
  DrawCall *pDVar35;
  int iVar36;
  DrawCall *call_1;
  long lVar37;
  DrawCall *call;
  ulong uVar38;
  pointer puVar39;
  pointer puVar40;
  int iVar41;
  bool bVar42;
  bool bVar43;
  float fVar44;
  float fVar45;
  Random rnd;
  deUint32 available;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputData;
  Surface frameWithoutTf;
  Surface frameWithTf;
  deUint32 numPrimitives;
  Query primitiveQuery;
  byte local_33c;
  ulong local_330;
  uint local_328;
  int local_320;
  int local_2ec;
  int local_2e8;
  deRandom local_2e0;
  AttributeNameEquals local_2d0;
  DrawCall *local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  long local_290;
  ulong local_288;
  int local_27c;
  ulong local_278;
  ulong local_270;
  long local_268;
  DrawCall *local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  Surface local_240;
  Surface local_228;
  undefined7 *local_210;
  undefined8 local_208;
  undefined7 local_200;
  undefined4 uStack_1f9;
  undefined1 local_1f5;
  ObjectWrapper local_1f0;
  ulong local_1d8;
  long local_1d0;
  long local_1c8;
  pointer local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar20;
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2b0 = first;
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar10);
  deRandom_init(&local_2e0,seed);
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar10 = *(int *)CONCAT44(extraout_var_00,iVar10);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar19 = 0x80;
  if (iVar10 < 0x80) {
    iVar19 = iVar10;
  }
  iVar11 = *(int *)(CONCAT44(extraout_var_01,iVar11) + 4);
  iVar36 = 0x80;
  if (iVar11 < 0x80) {
    iVar36 = iVar11;
  }
  dVar12 = deRandom_getUint32(&local_2e0);
  x = dVar12 % ((iVar10 - iVar19) + 1U);
  dVar12 = deRandom_getUint32(&local_2e0);
  y = dVar12 % ((iVar11 - iVar36) + 1U);
  tcu::Surface::Surface(&local_228,iVar19,iVar36);
  local_298 = CONCAT44(local_298._4_4_,iVar36);
  tcu::Surface::Surface(&local_240,iVar19,iVar36);
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper(&local_1f0,(Functions *)CONCAT44(extraout_var_02,iVar10),traits)
  ;
  if (local_2b0 == end) {
    local_320 = 0;
    local_328 = 0;
  }
  else {
    dVar12 = this->m_primitiveType;
    local_328 = 0;
    local_320 = 0;
    pDVar30 = local_2b0;
    do {
      iVar10 = pDVar30->numElements;
      dVar13 = 0;
      if (pDVar30->transformFeedbackEnabled == true) {
        dVar13 = getTransformFeedbackOutputCount(dVar12,iVar10);
      }
      local_320 = local_320 + dVar13;
      local_328 = local_328 + iVar10;
      pDVar30 = pDVar30 + 1;
    } while (pDVar30 != end);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_258,(long)(int)(this->m_inputStride * local_328),(allocator_type *)local_1b0);
  puVar39 = local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar10 = this->m_inputStride;
  _Var21._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_2d0.name.field_2;
  local_2d0.name.field_2._M_allocated_capacity = 0x697469736f705f61;
  local_2d0.name.field_2._8_2_ = 0x6e6f;
  local_2d0.name._M_string_length = 10;
  local_2d0.name.field_2._M_local_buf[10] = '\0';
  local_2d0.name._M_dataplus._M_p = (pointer)paVar1;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_1b0,paVar1);
  _Var21 = std::
           find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                     (_Var21,_Var3,(AttributeNameEquals *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.name._M_dataplus._M_p,local_2d0.name.field_2._M_allocated_capacity + 1
                   );
  }
  uVar38 = (ulong)local_328;
  if (0 < (int)local_328) {
    iVar11 = 0;
    uVar33 = uVar38;
    do {
      iVar36 = (_Var21._M_current)->offset;
      fVar44 = deRandom_getFloat(&local_2e0);
      *(float *)(puVar39 + (long)iVar11 + (long)iVar36) = fVar44 * 2.4 + -1.2;
      fVar44 = deRandom_getFloat(&local_2e0);
      *(float *)(puVar39 + (long)iVar11 + (long)iVar36 + 4) = fVar44 * 2.4 + -1.2;
      fVar44 = deRandom_getFloat(&local_2e0);
      *(float *)(puVar39 + (long)iVar11 + (long)iVar36 + 8) = fVar44 * 2.4 + -1.2;
      fVar44 = deRandom_getFloat(&local_2e0);
      *(float *)(puVar39 + (long)iVar11 + (long)iVar36 + 0xc) = fVar44 * 1.9 + 0.1;
      iVar11 = iVar11 + iVar10;
      uVar33 = uVar33 - 1;
    } while (uVar33 != 0);
  }
  _Var21._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_200 = 0x746e696f705f61;
  uStack_1f9 = 0x657a6953;
  local_208 = 0xb;
  local_1f5 = 0;
  paVar1 = &local_2d0.name.field_2;
  local_2d0.name._M_dataplus._M_p = (pointer)paVar1;
  local_210 = &local_200;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,&local_200);
  _Var21 = std::
           find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                     (_Var21,_Var3,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.name._M_dataplus._M_p,local_2d0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT17((undefined1)uStack_1f9,local_200) + 1);
  }
  if ((0 < (int)local_328) &&
     (_Var21._M_current !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    iVar11 = 0;
    do {
      iVar36 = (_Var21._M_current)->offset;
      fVar44 = deRandom_getFloat(&local_2e0);
      *(float *)(puVar39 + (long)iVar11 + (long)iVar36) = fVar44 * 7.0 + 1.0;
      iVar11 = iVar11 + iVar10;
      uVar38 = uVar38 - 1;
    } while (uVar38 != 0);
  }
  for (pAVar31 = (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pAVar31 !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish; pAVar31 = pAVar31 + 1) {
    iVar11 = std::__cxx11::string::compare((char *)pAVar31);
    if ((iVar11 != 0) && (iVar11 = std::__cxx11::string::compare((char *)pAVar31), iVar11 != 0)) {
      DVar17 = (pAVar31->type).m_data.basic.type;
      PVar2 = (pAVar31->type).m_data.basic.precision;
      iVar11 = glu::getDataTypeScalarSize(DVar17);
      if (0 < (int)local_328) {
        local_288 = (ulong)(DVar17 - TYPE_UINT);
        iVar36 = 0;
        uVar14 = 0;
        do {
          local_290 = CONCAT44(local_290._4_4_,iVar36);
          iVar41 = iVar11;
          if (0 < iVar11) {
            do {
              iVar15 = pAVar31->offset + iVar36;
              if (DVar17 - TYPE_FLOAT < 4) {
                if (PVar2 == PRECISION_HIGHP) {
                  fVar44 = deRandom_getFloat(&local_2e0);
                  fVar44 = fVar44 * 200000.0 + -100000.0;
                }
                else if (PVar2 == PRECISION_MEDIUMP) {
                  fVar44 = deRandom_getFloat(&local_2e0);
                  fVar44 = fVar44 * 2000.0 + -1000.0;
                }
                else {
                  if (PVar2 != PRECISION_LOWP) goto LAB_0118353b;
                  dVar12 = deRandom_getUint32(&local_2e0);
                  fVar44 = (float)(dVar12 % 5) * 0.25 + 0.0;
                }
                *(float *)(puVar39 + iVar15) = fVar44;
              }
              else if (DVar17 - TYPE_INT < 4) {
                if (PVar2 == PRECISION_HIGHP) {
                  uVar16 = deRandom_getUint32(&local_2e0);
LAB_01183532:
                  *(uint *)(puVar39 + iVar15) = uVar16;
                }
                else {
                  if (PVar2 == PRECISION_MEDIUMP) {
                    dVar12 = deRandom_getUint32(&local_2e0);
                    uVar16 = dVar12 & 0xffff;
                    uVar26 = (int)(short)dVar12 & 0xffff0000;
                  }
                  else {
                    if (PVar2 != PRECISION_LOWP) goto LAB_0118353b;
                    dVar12 = deRandom_getUint32(&local_2e0);
                    uVar16 = dVar12 & 0xff;
                    uVar26 = (int)(char)dVar12 & 0xffffff00;
                  }
                  *(uint *)(puVar39 + iVar15) = uVar26 | uVar16;
                }
              }
              else if ((uint)local_288 < 4) {
                if (PVar2 == PRECISION_HIGHP) {
                  uVar16 = deRandom_getUint32(&local_2e0);
                }
                else if (PVar2 == PRECISION_MEDIUMP) {
                  dVar12 = deRandom_getUint32(&local_2e0);
                  uVar16 = dVar12 & 0xffff;
                }
                else {
                  if (PVar2 != PRECISION_LOWP) goto LAB_0118353b;
                  dVar12 = deRandom_getUint32(&local_2e0);
                  uVar16 = dVar12 & 0xff;
                }
                goto LAB_01183532;
              }
LAB_0118353b:
              iVar36 = iVar36 + 4;
              iVar41 = iVar41 + -1;
            } while (iVar41 != 0);
          }
          uVar14 = uVar14 + 1;
          iVar36 = (int)local_290 + iVar10;
        } while (uVar14 != local_328);
      }
    }
  }
  (**(code **)(lVar20 + 0xd0))(0x8e22,(this->m_transformFeedback->super_ObjectWrapper).m_object);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"glBindTransformFeedback()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x449);
  puVar22 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputBuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar22) >> 2)) {
    uVar38 = 0;
    do {
      uVar14 = puVar22[uVar38];
      iVar10 = (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar38];
      (**(code **)(lVar20 + 0x40))(0x8c8e,uVar14);
      iVar11 = iVar10 * local_320;
      iVar10 = iVar10 * 2;
      (**(code **)(lVar20 + 0x150))(0x8c8e,(long)(iVar10 + iVar11),0,0x88e9);
      __s = (void *)(**(code **)(lVar20 + 0xd00))(0x8c8e,(long)iVar11,(long)iVar10,2);
      if (__s != (void *)0x0) {
        memset(__s,0xcd,(long)iVar10);
      }
      (**(code **)(lVar20 + 0x1670))(0x8c8e);
      dVar12 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar12,"guardband write",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x324);
      (**(code **)(lVar20 + 0x48))(0x8c8e,uVar38 & 0xffffffff,uVar14);
      dVar12 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar12,"transform feedback buffer setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x45c);
      uVar38 = uVar38 + 1;
      puVar22 = (this->m_outputBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while ((long)uVar38 <
             (long)(int)((ulong)((long)(this->m_outputBuffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar22)
                        >> 2));
  }
  for (pAVar31 = (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pAVar31 !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish; pAVar31 = pAVar31 + 1) {
    iVar10 = (**(code **)(lVar20 + 0x780))
                       ((this->m_program->m_program).m_program,(pAVar31->name)._M_dataplus._M_p);
    DVar17 = glu::getDataTypeScalarType((pAVar31->type).m_data.basic.type);
    iVar11 = glu::getDataTypeScalarSize((pAVar31->type).m_data.basic.type);
    if (-1 < iVar10) {
      puVar39 = local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + pAVar31->offset;
      (**(code **)(lVar20 + 0x610))(iVar10);
      if (DVar17 == TYPE_UINT) {
        uVar29 = 0x1405;
      }
      else {
        if (DVar17 != TYPE_INT) {
          if (DVar17 == TYPE_FLOAT) {
            (**(code **)(lVar20 + 0x19f0))(iVar10,iVar11,0x1406,0,this->m_inputStride);
          }
          goto LAB_011837a4;
        }
        uVar29 = 0x1404;
      }
      (**(code **)(lVar20 + 0x1958))(iVar10,iVar11,uVar29,this->m_inputStride,puVar39);
    }
LAB_011837a4:
  }
  (**(code **)(lVar20 + 0x1a00))(x,y,iVar19,local_298 & 0xffffffff);
  pDVar30 = local_2b0;
  (**(code **)(lVar20 + 0x1680))((this->m_program->m_program).m_program);
  pcVar4 = *(code **)(lVar20 + 0x15a8);
  uVar18 = (**(code **)(lVar20 + 0xb48))((this->m_program->m_program).m_program,"u_scale");
  lVar28 = 0;
  do {
    *(undefined4 *)(local_1b0 + lVar28 * 4) = 0x3c23d70a;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 4);
  (*pcVar4)(uVar18,1,local_1b0);
  pcVar4 = *(code **)(lVar20 + 0x15a8);
  uVar18 = (**(code **)(lVar20 + 0xb48))((this->m_program->m_program).m_program,"u_bias");
  lVar28 = 0;
  do {
    *(undefined4 *)(local_1b0 + lVar28 * 4) = 0x3f000000;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 4);
  (*pcVar4)(uVar18,1,local_1b0);
  (**(code **)(lVar20 + 0x20))(0x8c88,local_1f0.m_object);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x47c);
  (**(code **)(lVar20 + 0x188))(0x4000);
  uVar18 = 0;
  if ((ulong)this->m_primitiveType < 7) {
    uVar18 = *(undefined4 *)(&DAT_01c35e58 + (ulong)this->m_primitiveType * 4);
  }
  (**(code **)(lVar20 + 0x30))(uVar18);
  if (pDVar30 != end) {
    iVar10 = 0;
    bVar32 = 1;
    do {
      if (pDVar30->transformFeedbackEnabled != (bool)(bVar32 & 1)) {
        puVar23 = (undefined8 *)(lVar20 + 0xfe0);
        if (pDVar30->transformFeedbackEnabled != false) {
          puVar23 = (undefined8 *)(lVar20 + 0x1248);
        }
        (*(code *)*puVar23)();
        bVar32 = pDVar30->transformFeedbackEnabled;
      }
      (**(code **)(lVar20 + 0x538))(this->m_primitiveType,iVar10,pDVar30->numElements);
      iVar10 = iVar10 + pDVar30->numElements;
      pDVar30 = pDVar30 + 1;
    } while (pDVar30 != end);
    if ((bVar32 & 1) == 0) {
      (**(code **)(lVar20 + 0x1248))();
    }
  }
  (**(code **)(lVar20 + 0x638))();
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x49c);
  (**(code **)(lVar20 + 0x628))(0x8c88);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a0);
  local_2d0.name._M_dataplus._M_p = local_2d0.name._M_dataplus._M_p & 0xffffffff00000000;
  (**(code **)(lVar20 + 0xa20))(local_1f0.m_object,0x8867);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"glGetQueryObjectuiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a6);
  poVar34 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar34,"GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: ",
             0x3e);
  pcVar7 = "mapped_ == GL_TRUE";
  if ((ChannelOrder)local_2d0.name._M_dataplus._M_p == R) {
    pcVar7 = "mapped_ == GL_FALSE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar34,pcVar7 + 0xb,
             (ulong)((ChannelOrder)local_2d0.name._M_dataplus._M_p == R) + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar34);
  std::ios_base::~ios_base(local_138);
  puVar22 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar40 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)puVar40 - (long)puVar22) >> 2) < 1) {
    local_33c = 1;
  }
  else {
    local_33c = 1;
    uVar38 = 0;
    do {
      local_2a0 = (ulong)(uint)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar38];
      local_270 = uVar38;
      (**(code **)(lVar20 + 0x40))(0x8c8e,puVar22[uVar38]);
      uVar16 = (int)local_2a0 * local_320;
      local_1d8 = (ulong)uVar16;
      uVar14 = (int)local_2a0 * 2;
      local_278 = (ulong)uVar14;
      local_268 = (**(code **)(lVar20 + 0xd00))(0x8c8e,0,(long)(int)(uVar14 + uVar16),1);
      dVar12 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar12,"mapping buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x4b7);
      for (pOVar24 = (this->m_transformFeedbackOutputs).
                     super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pOVar24 !=
          (this->m_transformFeedbackOutputs).
          super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
          ._M_impl.super__Vector_impl_data._M_finish; pOVar24 = pOVar24 + 1) {
        if (local_270 == (uint)pOVar24->bufferNdx && local_2b0 != end) {
          local_2e8 = 0;
          local_2ec = 0;
          pDVar30 = local_2b0;
          do {
            if (pDVar30->transformFeedbackEnabled == true) {
              ppAVar25 = (pOVar24->inputs).
                         super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              local_260 = pDVar30;
              if ((int)((ulong)((long)(pOVar24->inputs).
                                      super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar25)
                       >> 3) < 1) {
                bVar42 = true;
              }
              else {
                dVar12 = this->m_primitiveType;
                local_27c = this->m_inputStride;
                iVar10 = pDVar30->numElements;
                local_2a8 = (ulong)(uint)pOVar24->offset;
                local_1d0 = local_2e8 * (int)local_2a0 + local_268;
                local_1c0 = local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_27c * local_2ec;
                bVar42 = true;
                lVar28 = 0;
                do {
                  pAVar5 = ppAVar25[lVar28];
                  DVar17 = (pAVar5->type).m_data.basic.type;
                  local_1c8 = lVar28;
                  iVar19 = glu::getDataTypeScalarSize(DVar17);
                  PVar2 = (pAVar5->type).m_data.basic.precision;
                  DVar17 = glu::getDataTypeScalarType(DVar17);
                  dVar13 = getTransformFeedbackOutputCount(dVar12,iVar10);
                  if (0 < (int)dVar13) {
                    local_1b8 = (int)local_2a8 + local_1d0;
                    local_298 = (ulong)dVar13;
                    iVar11 = 0;
                    local_330 = 0;
                    do {
                      puVar39 = local_1c0;
                      iVar36 = (int)local_330;
                      if (dVar12 < 7) {
                        uVar38 = local_330 & 0xffffffff;
                        switch(dVar12) {
                        case 2:
                          uVar14 = iVar36 - ((int)(((uint)(local_330 >> 0x1f) & 1) + iVar36) >> 1);
                          if (iVar10 <= (int)uVar14) {
                            uVar14 = 0;
                          }
                          uVar38 = (ulong)uVar14;
                          break;
                        case 3:
                          uVar38 = (ulong)(uint)(iVar36 - ((int)(((uint)(local_330 >> 0x1f) & 1) +
                                                                iVar36) >> 1));
                          break;
                        case 5:
                          iVar41 = (int)((local_330 & 0xffffffff) / 3);
                          uVar16 = iVar36 + iVar41 * -3;
                          uVar14 = (iVar41 - uVar16) + 1;
                          if (((local_330 & 0xffffffff) / 3 & 1) == 0) {
                            uVar14 = iVar41 + uVar16;
                          }
                          if (1 < uVar16) {
                            uVar14 = iVar41 + uVar16;
                          }
                          uVar38 = (ulong)uVar14;
                          break;
                        case 6:
                          iVar41 = iVar36 + (int)((local_330 & 0xffffffff) / 3) * -3;
                          if (iVar41 == 0) goto LAB_01183db7;
                          uVar38 = (ulong)(uint)((int)((local_330 & 0xffffffff) / 3) + iVar41);
                        }
                      }
                      else {
LAB_01183db7:
                        uVar38 = 0;
                      }
                      poVar34 = (ostringstream *)(local_1b0 + 8);
                      if (0 < iVar19) {
                        lVar28 = iVar11 + local_1b8;
                        iVar41 = (int)uVar38 * local_27c;
                        lVar37 = 0;
                        local_290 = lVar28;
                        local_288 = uVar38;
                        do {
                          lVar8 = (long)pAVar5->offset + (long)iVar41;
                          iVar15 = *(int *)(puVar39 + lVar37 * 4 + lVar8);
                          iVar27 = *(int *)(lVar28 + lVar37 * 4);
                          if (DVar17 == TYPE_FLOAT) {
                            if (PVar2 == PRECISION_LOWP) {
                              fVar45 = *(float *)(puVar39 + lVar37 * 4 + lVar8) -
                                       *(float *)(lVar28 + lVar37 * 4);
                              fVar44 = -fVar45;
                              if (-fVar45 <= fVar45) {
                                fVar44 = fVar45;
                              }
                              bVar43 = fVar44 < 0.1;
                            }
                            else {
                              if (PVar2 == PRECISION_MEDIUMP) {
                                iVar15 = iVar15 - iVar27;
                                iVar27 = -iVar15;
                                if (0 < iVar15) {
                                  iVar27 = iVar15;
                                }
                                bVar43 = SBORROW4(iVar27,0x2002);
                                iVar27 = iVar27 + -0x2002;
                              }
                              else {
                                if (PVar2 != PRECISION_HIGHP) {
                                  bVar43 = false;
                                  goto LAB_01183e95;
                                }
                                iVar15 = iVar15 - iVar27;
                                iVar27 = -iVar15;
                                if (0 < iVar15) {
                                  iVar27 = iVar15;
                                }
                                bVar43 = SBORROW4(iVar27,2);
                                iVar27 = iVar27 + -2;
                              }
                              bVar43 = bVar43 != iVar27 < 0;
                            }
                          }
                          else {
                            bVar43 = iVar15 == iVar27;
                          }
LAB_01183e95:
                          if (!bVar43) {
                            local_1b0._0_8_ = log;
                            std::__cxx11::ostringstream::ostringstream(poVar34);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34,"Mismatch in ",0xc);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34,(pOVar24->name)._M_dataplus._M_p,
                                       (pOVar24->name)._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34," (",2);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34,(pAVar5->name)._M_dataplus._M_p,
                                       (pAVar5->name)._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34,"), output = ",0xc);
                            std::ostream::operator<<(poVar34,iVar36);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34,", input = ",10);
                            std::ostream::operator<<(poVar34,(int)local_288);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)poVar34,", component = ",0xe);
                            std::ostream::operator<<(poVar34,(int)lVar37);
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_1b0,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                            std::__cxx11::ostringstream::~ostringstream(poVar34);
                            std::ios_base::~ios_base(local_138);
                            bVar42 = false;
                            lVar28 = local_290;
                          }
                          lVar37 = lVar37 + 1;
                        } while ((bool)(lVar37 < iVar19 & bVar43));
                      }
                      if (!bVar42) break;
                      local_330 = local_330 + 1;
                      iVar11 = iVar11 + (int)local_2a0;
                    } while (local_330 < local_298);
                  }
                  if (!bVar42) break;
                  local_2a8 = (ulong)(uint)((int)local_2a8 + iVar19 * 4);
                  lVar28 = local_1c8 + 1;
                  ppAVar25 = (pOVar24->inputs).
                             super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar28 < (int)((ulong)((long)(pOVar24->inputs).
                                                                                                            
                                                  super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppAVar25) >> 3));
              }
              pDVar30 = local_260;
              if (!bVar42) {
                local_33c = 0;
                break;
              }
            }
            iVar10 = pDVar30->numElements;
            dVar12 = 0;
            if (pDVar30->transformFeedbackEnabled == true) {
              dVar12 = getTransformFeedbackOutputCount(this->m_primitiveType,iVar10);
            }
            local_2ec = local_2ec + iVar10;
            local_2e8 = local_2e8 + dVar12;
            pDVar30 = pDVar30 + 1;
          } while (pDVar30 != end);
        }
      }
      bVar42 = (int)local_278 < 1;
      if (0 < (int)local_278) {
        if (*(char *)(local_268 + (int)local_1d8) == -0x33) {
          uVar38 = 1;
          do {
            uVar33 = uVar38;
            if ((local_278 & 0xffffffff) == uVar33) break;
            uVar38 = uVar33 + 1;
          } while (((char *)(local_268 + (int)local_1d8))[uVar33] == -0x33);
          bVar42 = (local_278 & 0xffffffff) <= uVar33;
        }
      }
      poVar34 = (ostringstream *)(local_1b0 + 8);
      if (!bVar42) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar34,"Error: Transform feedback buffer overrun detected",0x31);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar34);
        std::ios_base::~ios_base(local_138);
        local_33c = 0;
      }
      (**(code **)(lVar20 + 0x1670))(0x8c8e);
      uVar38 = local_270 + 1;
      puVar22 = (this->m_outputBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar40 = (this->m_outputBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while ((long)uVar38 < (long)(int)((ulong)((long)puVar40 - (long)puVar22) >> 2));
  }
  pDVar30 = local_2b0;
  iVar10 = 0;
  if (local_2b0 != end) {
    iVar10 = 0;
    pDVar35 = local_2b0;
    do {
      if (pDVar35->transformFeedbackEnabled != true) goto LAB_01184255;
      if (6 < this->m_primitiveType) {
        iVar19 = 0;
        goto switchD_01184204_caseD_0;
      }
      iVar19 = pDVar35->numElements;
      switch(this->m_primitiveType) {
      case 0:
        break;
      case 1:
        iVar19 = iVar19 / 2;
        break;
      case 2:
        if (iVar19 < 2) {
          iVar19 = 0;
        }
        break;
      case 3:
        iVar19 = iVar19 + -1;
        goto LAB_01184239;
      case 4:
        iVar19 = iVar19 / 3;
        break;
      default:
        iVar19 = iVar19 + -2;
LAB_01184239:
        if (iVar19 < 1) {
          iVar19 = 0;
        }
      }
switchD_01184204_caseD_0:
      iVar10 = iVar10 + iVar19;
LAB_01184255:
      pDVar35 = pDVar35 + 1;
    } while (pDVar35 != end);
  }
  local_2d0.name._M_dataplus._M_p = local_2d0.name._M_dataplus._M_p & 0xffffffff00000000;
  local_210 = (undefined7 *)((ulong)local_210 & 0xffffffff00000000);
  (**(code **)(lVar20 + 0xa20))(local_1f0.m_object,0x8867);
  (**(code **)(lVar20 + 0xa20))(local_1f0.m_object,0x8866,&local_210);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"glGetQueryObjectuiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4e9);
  bVar42 = (ChannelOrder)local_2d0.name._M_dataplus._M_p != R;
  if (!bVar42 && puVar22 == puVar40) {
    poVar34 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar34,
               "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!"
               ,0x5b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar34);
    std::ios_base::~ios_base(local_138);
  }
  poVar34 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar34,"GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = ",0x2b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar34);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar34);
  std::ios_base::~ios_base(local_138);
  bVar43 = (int)local_210 == iVar10;
  if (!bVar43) {
    poVar34 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar34,"ERROR: Expected ",0x10);
    std::ostream::operator<<(poVar34,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar34," primitives!",0xc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar34);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(lVar20 + 0xd0))(0x8e22,0);
  if (0 < (int)((ulong)((long)(this->m_outputBuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_outputBuffers).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    iVar10 = 0;
    do {
      (**(code **)(lVar20 + 0x40))(0x8c8e,0);
      (**(code **)(lVar20 + 0x48))(0x8c8e,iVar10,0);
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)((ulong)((long)(this->m_outputBuffers).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_outputBuffers).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pRVar6 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d0.name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_228.m_pixels.m_cap != (void *)0x0) {
    local_228.m_pixels.m_cap = (size_t)local_228.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_228.m_width,
             local_228.m_height,1,(void *)local_228.m_pixels.m_cap);
  glu::readPixels(pRVar6,x,y,(PixelBufferAccess *)local_1b0);
  (**(code **)(lVar20 + 0x188))(0x4000);
  if (pDVar30 != end) {
    iVar10 = 0;
    do {
      (**(code **)(lVar20 + 0x538))(this->m_primitiveType,iVar10,pDVar30->numElements);
      iVar10 = iVar10 + pDVar30->numElements;
      pDVar30 = pDVar30 + 1;
    } while (pDVar30 != end);
  }
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,"render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x511);
  pRVar6 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d0.name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
    local_240.m_pixels.m_cap = (size_t)local_240.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_240.m_width,
             local_240.m_height,1,(void *)local_240.m_pixels.m_cap);
  glu::readPixels(pRVar6,x,y,(PixelBufferAccess *)local_1b0);
  local_1b0._0_4_ = 0x1010101;
  bVar9 = tcu::pixelThresholdCompare
                    ((TestLog *)log,"Result","Image comparison result",&local_240,&local_228,
                     (RGBA *)local_1b0,COMPARE_LOG_ON_ERROR);
  if (bVar9) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Rendering result comparison between TF enabled and TF disabled passed.",0x46);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "ERROR: Rendering result comparison between TF enabled and TF disabled failed!",0x4d)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_1f0);
  tcu::Surface::~Surface(&local_240);
  tcu::Surface::~Surface(&local_228);
  return (bool)((bVar43 && (bVar42 || puVar22 != puVar40)) & local_33c & bVar9);
}

Assistant:

bool TransformFeedbackCase::runTest (const DrawCall* first, const DrawCall* end, deUint32 seed)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	de::Random				rnd				(seed);
	int						numInputs		= 0;		//!< Sum of element counts in calls.
	int						numOutputs		= 0;		//!< Sum of output counts for calls that have transform feedback enabled.
	int						width			= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height			= m_context.getRenderContext().getRenderTarget().getHeight();
	int						viewportW		= de::min((int)VIEWPORT_WIDTH, width);
	int						viewportH		= de::min((int)VIEWPORT_HEIGHT, height);
	int						viewportX		= rnd.getInt(0, width-viewportW);
	int						viewportY		= rnd.getInt(0, height-viewportH);
	tcu::Surface			frameWithTf		(viewportW, viewportH);
	tcu::Surface			frameWithoutTf	(viewportW, viewportH);
	glu::Query				primitiveQuery	(m_context.getRenderContext());
	bool					outputsOk		= true;
	bool					imagesOk		= true;
	bool					queryOk			= true;

	// Compute totals.
	for (const DrawCall* call = first; call != end; call++)
	{
		numInputs	+= call->numElements;
		numOutputs	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
	}

	// Input data.
	vector<deUint8> inputData(m_inputStride*numInputs);
	genInputData(m_attributes, numInputs, m_inputStride, &inputData[0], rnd);

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transformFeedback->get());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback()");

	// Allocate storage for transform feedback output buffers and bind to targets.
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufNdx];
		int				stride		= m_bufferStrides[bufNdx];
		int				target		= bufNdx;
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const deUint32	usage		= GL_DYNAMIC_READ;

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, size+guardSize, DE_NULL, usage);
		writeBufferGuard(gl, GL_TRANSFORM_FEEDBACK_BUFFER, size, guardSize);

		// \todo [2012-07-30 pyry] glBindBufferRange()?
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, target, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "transform feedback buffer setup");
	}

	// Setup attributes.
	for (vector<Attribute>::const_iterator attrib = m_attributes.begin(); attrib != m_attributes.end(); attrib++)
	{
		int				loc				= gl.getAttribLocation(m_program->getProgram(), attrib->name.c_str());
		glu::DataType	scalarType		= glu::getDataTypeScalarType(attrib->type.getBasicType());
		int				numComponents	= glu::getDataTypeScalarSize(attrib->type.getBasicType());
		const void*		ptr				= &inputData[0] + attrib->offset;

		if (loc >= 0)
		{
			gl.enableVertexAttribArray(loc);

			if (scalarType == glu::TYPE_FLOAT)		gl.vertexAttribPointer	(loc, numComponents, GL_FLOAT, GL_FALSE, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_INT)	gl.vertexAttribIPointer	(loc, numComponents, GL_INT, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_UINT)	gl.vertexAttribIPointer	(loc, numComponents, GL_UNSIGNED_INT, m_inputStride, ptr);
		}
	}

	// Setup viewport.
	gl.viewport(viewportX, viewportY, viewportW, viewportH);

	// Setup program.
	gl.useProgram(m_program->getProgram());

	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_scale"),	1, tcu::Vec4(0.01f).getPtr());
	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_bias"),		1, tcu::Vec4(0.5f).getPtr());

	// Enable query.
	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *primitiveQuery);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Draw.
	{
		int		offset		= 0;
		bool	tfEnabled	= true;

		gl.clear(GL_COLOR_BUFFER_BIT);

		gl.beginTransformFeedback(getTransformFeedbackPrimitiveMode(m_primitiveType));

		for (const DrawCall* call = first; call != end; call++)
		{
			// Pause or resume transform feedback if necessary.
			if (call->transformFeedbackEnabled != tfEnabled)
			{
				if (call->transformFeedbackEnabled)
					gl.resumeTransformFeedback();
				else
					gl.pauseTransformFeedback();
				tfEnabled = call->transformFeedbackEnabled;
			}

			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		// Resume feedback before finishing it.
		if (!tfEnabled)
			gl.resumeTransformFeedback();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
	}

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Check and log query status right after submit
	{
		deUint32 available = GL_FALSE;
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: " << (available != GL_FALSE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	}

	// Compare result buffers.
	for (int bufferNdx = 0; bufferNdx < (int)m_outputBuffers.size(); bufferNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufferNdx];
		int				stride		= m_bufferStrides[bufferNdx];
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const void*		bufPtr		= DE_NULL;

		// Bind buffer for reading.
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		bufPtr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, size+guardSize, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapping buffer");

		// Verify all output variables that are written to this buffer.
		for (vector<Output>::const_iterator out = m_transformFeedbackOutputs.begin(); out != m_transformFeedbackOutputs.end(); out++)
		{
			if (out->bufferNdx != bufferNdx)
				continue;

			int inputOffset		= 0;
			int	outputOffset	= 0;

			// Process all draw calls and check ones with transform feedback enabled.
			for (const DrawCall* call = first; call != end; call++)
			{
				if (call->transformFeedbackEnabled)
				{
					const deUint8*	inputPtr	= &inputData[0] + inputOffset*m_inputStride;
					const deUint8*	outputPtr	= (const deUint8*)bufPtr + outputOffset*stride;

					if (!compareTransformFeedbackOutput(log, m_primitiveType, *out, call->numElements, inputPtr, m_inputStride, outputPtr, stride))
					{
						outputsOk = false;
						break;
					}
				}

				inputOffset		+= call->numElements;
				outputOffset	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
			}
		}

		// Verify guardband.
		if (!verifyGuard((const deUint8*)bufPtr + size, guardSize))
		{
			log << TestLog::Message << "Error: Transform feedback buffer overrun detected" << TestLog::EndMessage;
			outputsOk = false;
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	// Check status after mapping buffers.
	{
		const bool	mustBeReady		= !m_outputBuffers.empty(); // Mapping buffer forces synchronization.
		const int	expectedCount	= computeTransformFeedbackPrimitiveCount(m_primitiveType, first, end);
		deUint32	available		= GL_FALSE;
		deUint32	numPrimitives	= 0;

		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT, &numPrimitives);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		if (!mustBeReady && available == GL_FALSE)
		{
			log << TestLog::Message << "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!" << TestLog::EndMessage;
			queryOk = false;
		}

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = " << numPrimitives << TestLog::EndMessage;

		if ((int)numPrimitives != expectedCount)
		{
			log << TestLog::Message << "ERROR: Expected " << expectedCount << " primitives!" << TestLog::EndMessage;
			queryOk = false;
		}
	}

	// Clear transform feedback state.
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		gl.bindBuffer		(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.bindBufferBase	(GL_TRANSFORM_FEEDBACK_BUFFER, bufNdx, 0);
	}

	// Read back rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithTf.getAccess());

	// Render without transform feedback.
	{
		int offset = 0;

		gl.clear(GL_COLOR_BUFFER_BIT);

		for (const DrawCall* call = first; call != end; call++)
		{
			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithoutTf.getAccess());
	}

	// Compare images with and without transform feedback.
	imagesOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", frameWithoutTf, frameWithTf, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_ON_ERROR);

	if (imagesOk)
		m_testCtx.getLog() << TestLog::Message << "Rendering result comparison between TF enabled and TF disabled passed." << TestLog::EndMessage;
	else
		m_testCtx.getLog() << TestLog::Message << "ERROR: Rendering result comparison between TF enabled and TF disabled failed!" << TestLog::EndMessage;

	return outputsOk && imagesOk && queryOk;
}